

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int cmfm1b_(int *lot,int *jump,int *n,int *inc,fft_complex_t *c__,double *ch,double *wa,double *fnf,
           double *fac)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *ido_00;
  double *ch_00;
  int *in1;
  double *in_RCX;
  double *pdVar9;
  double *in_RDX;
  int *unaff_RBX;
  double *unaff_RBP;
  double *in_RSI;
  double *in_RDI;
  long in_R8;
  long in_R9;
  double *unaff_R12;
  double *unaff_R13;
  int *unaff_R14;
  double *unaff_R15;
  int *unaff_retaddr;
  long in_stack_00000008;
  double *in_stack_00000010;
  long in_stack_00000018;
  int *in_stack_00000028;
  double *in_stack_00000030;
  int *in_stack_00000038;
  int *in_stack_00000040;
  double *in_stack_00000048;
  int nbr;
  int ido;
  int lid;
  int iw;
  int ip;
  int nf;
  int na;
  int l2;
  int l1;
  int k1;
  int i__2;
  int i__1;
  double *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  ido_00 = (int *)(in_stack_00000008 + -8);
  ch_00 = (double *)(in_R9 + -8);
  in1 = (int *)(in_R8 + -0x10);
  iVar2 = (int)*in_stack_00000010;
  iVar12 = 0;
  iVar11 = 1;
  iVar14 = 1;
  iVar13 = 1;
  iVar15 = iVar2;
  do {
    if (iVar15 < iVar14) {
      return 0;
    }
    iVar3 = (int)*(double *)(in_stack_00000018 + -8 + (long)iVar14 * 8);
    iVar4 = iVar3 * iVar13;
    iVar5 = *(int *)in_RDX / iVar4;
    iVar6 = iVar13 * iVar5;
    iVar7 = iVar3 + -2;
    iVar8 = iVar12 + 1;
    iVar10 = iVar7;
    if (3 < iVar7) {
      iVar10 = 4;
    }
    iVar1 = iVar8 + iVar10 * 2;
    pdVar9 = (double *)(ulong)(iVar1 - 1);
    switch(pdVar9) {
    case (double *)0x0:
    default:
      cmf2kb_(ido_00 + (long)iVar11 * 2,(int *)in_RDI,&c__1,(int *)(ch_00 + 1),in_RCX,
              (int *)0x11fa3d,(int *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
              (int *)pdVar9,(int *)CONCAT44(iVar8,iVar10),(double *)CONCAT44(iVar5,iVar1));
      break;
    case (double *)0x1:
      cmf2kb_(ido_00 + (long)iVar11 * 2,(int *)in_RCX,(int *)in_RSI,in1 + 4,in_RDI,(int *)0x11fac1,
              (int *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,(int *)pdVar9,
              (int *)CONCAT44(iVar8,iVar10),(double *)CONCAT44(iVar5,iVar1));
      break;
    case (double *)0x2:
      cmf3kb_((int *)CONCAT44(iVar2,iVar3),(int *)CONCAT44(iVar11,iVar6),
              (int *)CONCAT44(iVar5,iVar1),(int *)CONCAT44(iVar8,iVar10),pdVar9,
              (int *)in_stack_ffffffffffffff58,(int *)CONCAT44(iVar15,iVar7),ch_00,in1,(int *)in_RCX
              ,in_RDX);
      break;
    case (double *)0x3:
      cmf3kb_((int *)CONCAT44(iVar2,iVar3),(int *)CONCAT44(iVar11,iVar6),
              (int *)CONCAT44(iVar5,iVar1),(int *)CONCAT44(iVar8,iVar10),pdVar9,
              (int *)in_stack_ffffffffffffff58,(int *)CONCAT44(iVar15,iVar7),ch_00,in1,(int *)in_RCX
              ,in_RDX);
      break;
    case (double *)0x4:
      cmf4kb_((int *)CONCAT44(iVar14,iVar13),(int *)CONCAT44(iVar4,iVar12),
              (int *)CONCAT44(iVar2,iVar3),(int *)CONCAT44(iVar11,iVar6),
              (double *)CONCAT44(iVar5,iVar1),(int *)CONCAT44(iVar8,iVar10),in1,in_RCX,(int *)in_RDX
              ,(int *)in_RSI,in_RDI);
      break;
    case (double *)0x5:
      cmf4kb_((int *)CONCAT44(iVar14,iVar13),(int *)CONCAT44(iVar4,iVar12),
              (int *)CONCAT44(iVar2,iVar3),(int *)CONCAT44(iVar11,iVar6),
              (double *)CONCAT44(iVar5,iVar1),(int *)CONCAT44(iVar8,iVar10),in1,in_RCX,(int *)in_RDX
              ,(int *)in_RSI,in_RDI);
      break;
    case (double *)0x6:
      cmf5kb_((int *)in_stack_00000010,ido_00,unaff_retaddr,(int *)unaff_RBP,unaff_R15,unaff_R14,
              in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,
              in_stack_00000048);
      break;
    case (double *)0x7:
      cmf5kb_((int *)in_stack_00000010,ido_00,unaff_retaddr,(int *)unaff_RBP,unaff_R15,unaff_R14,
              in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,
              in_stack_00000048);
      break;
    case (double *)0x8:
      in_stack_ffffffffffffff58 = (double *)(ido_00 + (long)iVar11 * 2);
      pdVar9 = in_RDI;
      cmfgkb_((int *)ch_00,(int *)CONCAT44(iVar15,iVar7),(int *)CONCAT44(iVar14,iVar13),
              (int *)CONCAT44(iVar4,iVar12),(int *)CONCAT44(iVar2,iVar3),
              (int *)CONCAT44(iVar11,iVar6),in_RDX,in_RSI,(int *)in_RDI,unaff_RBX,unaff_R12,
              unaff_R13,unaff_R14,(int *)unaff_R15,unaff_RBP);
      in_stack_ffffffffffffff50 = in_RDI;
      in_RDI = pdVar9;
      break;
    case (double *)0x9:
      in_stack_ffffffffffffff58 = (double *)(ido_00 + (long)iVar11 * 2);
      pdVar9 = in_RCX;
      cmfgkb_((int *)ch_00,(int *)CONCAT44(iVar15,iVar7),(int *)CONCAT44(iVar14,iVar13),
              (int *)CONCAT44(iVar4,iVar12),(int *)CONCAT44(iVar2,iVar3),
              (int *)CONCAT44(iVar11,iVar6),in_RDX,in_RSI,(int *)in_RDI,unaff_RBX,unaff_R12,
              unaff_R13,unaff_R14,(int *)unaff_R15,unaff_RBP);
      in_stack_ffffffffffffff50 = in_RCX;
      in_RCX = pdVar9;
    }
    iVar11 = (iVar3 + -1) * iVar5 * 2 + iVar11;
    if (iVar3 < 6) {
      iVar12 = 1 - iVar12;
    }
    iVar14 = iVar14 + 1;
    iVar13 = iVar4;
  } while( true );
}

Assistant:

int cmfm1b_(int *lot, int *jump, int *n, int
	*inc, complex *c__, fft_real_t *ch, fft_real_t *wa, fft_real_t *fnf, fft_real_t *fac)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
     int k1, l1, l2, na, nf, ip, iw, lid, ido, nbr;
    extern /* Subroutine */ int cmf2kb_(int *, int *, int *,
	    int *, fft_real_t *, int *, int *, fft_real_t *, int *,
	    int *, fft_real_t *), cmf3kb_(int *, int *, int *,
	    int *, fft_real_t *, int *, int *, fft_real_t *, int *,
	    int *, fft_real_t *), cmf4kb_(int *, int *, int *,
	    int *, fft_real_t *, int *, int *, fft_real_t *, int *,
	    int *, fft_real_t *), cmf5kb_(int *, int *, int *,
	    int *, fft_real_t *, int *, int *, fft_real_t *, int *,
	    int *, fft_real_t *), cmfgkb_(int *, int *, int *,
	    int *, int *, int *, fft_real_t *, fft_real_t *, int *,
	    int *, fft_real_t *, fft_real_t *, int *, int *, fft_real_t *);


/* FFTPACK 5.0 auxiliary routine */

    /* Parameter adjustments */
    --fac;
    --wa;
    --ch;
    --c__;

    /* Function Body */
    nf = *fnf;
    na = 0;
    l1 = 1;
    iw = 1;
    i__1 = nf;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1];
	l2 = ip * l1;
	ido = *n / l2;
	lid = l1 * ido;
/* Computing MIN */
	i__2 = ip - 2;
	nbr = na + 1 + (min(i__2,4) << 1);
	switch (nbr) {
	    case 1:  goto L52;
	    case 2:  goto L62;
	    case 3:  goto L53;
	    case 4:  goto L63;
	    case 5:  goto L54;
	    case 6:  goto L64;
	    case 7:  goto L55;
	    case 8:  goto L65;
	    case 9:  goto L56;
	    case 10:  goto L66;
	}
L52:
	cmf2kb_(lot, &ido, &l1, &na, (fft_real_t*)&c__[1], jump, inc, &ch[1], &c__1,
		 lot, &wa[iw]);
	goto L120;
L62:
	cmf2kb_(lot, &ido, &l1, &na, &ch[1], &c__1, lot, (fft_real_t*)&c__[1], jump,
		 inc, &wa[iw]);
	goto L120;
L53:
	cmf3kb_(lot, &ido, &l1, &na, (fft_real_t*)&c__[1], jump, inc, &ch[1], &c__1,
		 lot, &wa[iw]);
	goto L120;
L63:
	cmf3kb_(lot, &ido, &l1, &na, &ch[1], &c__1, lot, (fft_real_t*)&c__[1], jump,
		 inc, &wa[iw]);
	goto L120;
L54:
	cmf4kb_(lot, &ido, &l1, &na, (fft_real_t*)&c__[1], jump, inc, &ch[1], &c__1,
		 lot, &wa[iw]);
	goto L120;
L64:
	cmf4kb_(lot, &ido, &l1, &na, &ch[1], &c__1, lot, (fft_real_t*)&c__[1], jump,
		 inc, &wa[iw]);
	goto L120;
L55:
	cmf5kb_(lot, &ido, &l1, &na, (fft_real_t*)&c__[1], jump, inc, &ch[1], &c__1,
		 lot, &wa[iw]);
	goto L120;
L65:
	cmf5kb_(lot, &ido, &l1, &na, &ch[1], &c__1, lot, (fft_real_t*)&c__[1], jump,
		 inc, &wa[iw]);
	goto L120;
L56:
	cmfgkb_(lot, &ido, &ip, &l1, &lid, &na, (fft_real_t*)&c__[1], (fft_real_t*)&c__[1]
		, jump, inc, &ch[1], &ch[1], &c__1, lot, &wa[iw]);
	goto L120;
L66:
	cmfgkb_(lot, &ido, &ip, &l1, &lid, &na, &ch[1], &ch[1], &c__1, lot, (
		fft_real_t*)&c__[1], (fft_real_t*)&c__[1], jump, inc, &wa[iw]);
L120:
	l1 = l2;
	iw += (ip - 1) * (ido + ido);
	if (ip <= 5) {
	    na = 1 - na;
	}
/* L125: */
    }
    return 0;
}